

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_insert_new_key_value_at
               (roaring_array_t *ra,int32_t i,uint16_t key,container_t *c,uint8_t typecode)

{
  uint8_t typecode_local;
  container_t *c_local;
  uint16_t key_local;
  int32_t i_local;
  roaring_array_t *ra_local;
  
  extend_array(ra,1);
  memmove(ra->keys + (i + 1),ra->keys + i,(long)(ra->size - i) << 1);
  memmove(ra->containers + (i + 1),ra->containers + i,(long)(ra->size - i) << 3);
  memmove(ra->typecodes + (i + 1),ra->typecodes + i,(long)(ra->size - i));
  ra->keys[i] = key;
  ra->containers[i] = c;
  ra->typecodes[i] = typecode;
  ra->size = ra->size + 1;
  return;
}

Assistant:

void ra_insert_new_key_value_at(
    roaring_array_t *ra, int32_t i, uint16_t key,
    container_t *c, uint8_t typecode
){
    extend_array(ra, 1);
    // May be an optimization opportunity with DIY memmove
    memmove(&(ra->keys[i + 1]), &(ra->keys[i]),
            sizeof(uint16_t) * (ra->size - i));
    memmove(&(ra->containers[i + 1]), &(ra->containers[i]),
            sizeof(container_t *) * (ra->size - i));
    memmove(&(ra->typecodes[i + 1]), &(ra->typecodes[i]),
            sizeof(uint8_t) * (ra->size - i));
    ra->keys[i] = key;
    ra->containers[i] = c;
    ra->typecodes[i] = typecode;
    ra->size++;
}